

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ecdsa_sig_verify
              (LIBSSH2_SESSION *session,uchar *sig,size_t sig_len,uchar *m,size_t m_len,
              void **abstract)

{
  EC_KEY *ctx_00;
  int iVar1;
  EC_KEY *ctx;
  string_buf buf;
  size_t sStack_70;
  uint32_t len;
  size_t name_len;
  size_t s_len;
  size_t r_len;
  uchar *name;
  uchar *s;
  uchar *r;
  void **abstract_local;
  size_t m_len_local;
  uchar *m_local;
  size_t sig_len_local;
  uchar *sig_local;
  LIBSSH2_SESSION *session_local;
  
  ctx_00 = (EC_KEY *)*abstract;
  if (sig_len < 0x23) {
    session_local._4_4_ = -1;
  }
  else {
    ctx = (EC_KEY *)sig;
    buf.data = sig;
    buf.dataptr = (uchar *)sig_len;
    r = (uchar *)abstract;
    abstract_local = (void **)m_len;
    m_len_local = (size_t)m;
    m_local = (uchar *)sig_len;
    sig_len_local = (size_t)sig;
    sig_local = (uchar *)session;
    iVar1 = _libssh2_get_string((string_buf *)&ctx,(uchar **)&r_len,&stack0xffffffffffffff90);
    if ((iVar1 == 0) && (sStack_70 == 0x13)) {
      iVar1 = _libssh2_get_u32((string_buf *)&ctx,(uint32_t *)((long)&buf.len + 4));
      if ((iVar1 == 0) && (7 < buf.len._4_4_)) {
        iVar1 = _libssh2_get_string((string_buf *)&ctx,&s,&s_len);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_string((string_buf *)&ctx,&name,&name_len);
          if (iVar1 == 0) {
            session_local._4_4_ =
                 _libssh2_ecdsa_verify
                           (ctx_00,s,s_len,name,name_len,(uchar *)m_len_local,(size_t)abstract_local
                           );
          }
          else {
            session_local._4_4_ = -1;
          }
        }
        else {
          session_local._4_4_ = -1;
        }
      }
      else {
        session_local._4_4_ = -1;
      }
    }
    else {
      session_local._4_4_ = -1;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_sig_verify(LIBSSH2_SESSION * session,
                                    const unsigned char *sig,
                                    size_t sig_len,
                                    const unsigned char *m,
                                    size_t m_len, void **abstract)
{
    unsigned char *r, *s, *name;
    size_t r_len, s_len, name_len;
    uint32_t len;
    struct string_buf buf;
    libssh2_ecdsa_ctx *ctx = (libssh2_ecdsa_ctx *) (*abstract);

    (void)session;

    if(sig_len < 35)
        return -1;

    /* keyname_len(4) + keyname(19){"ecdsa-sha2-nistp256"} +
       signature_len(4) */
    buf.data = (unsigned char *)sig;
    buf.dataptr = buf.data;
    buf.len = sig_len;

    if(_libssh2_get_string(&buf, &name, &name_len) || name_len != 19)
        return -1;

    if(_libssh2_get_u32(&buf, &len) != 0 || len < 8)
        return -1;

    if(_libssh2_get_string(&buf, &r, &r_len))
        return -1;

    if(_libssh2_get_string(&buf, &s, &s_len))
        return -1;

    return _libssh2_ecdsa_verify(ctx, r, r_len, s, s_len, m, m_len);
}